

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

LocalNameInfo * __thiscall
luna::CodeGenerateVisitor::SearchFunctionLocalName
          (CodeGenerateVisitor *this,GenerateFunction *function,String *name)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  GenerateBlock *pGVar6;
  __node_base_ptr p_Var7;
  
  pGVar6 = function->current_block_;
  do {
    if (pGVar6 == (GenerateBlock *)0x0) {
      return (LocalNameInfo *)0x0;
    }
    uVar1 = (pGVar6->names_)._M_h._M_bucket_count;
    uVar5 = (ulong)name % uVar1;
    p_Var2 = (pGVar6->names_)._M_h._M_buckets[uVar5];
    p_Var3 = (__node_base_ptr)0x0;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var2, p_Var7 = p_Var2->_M_nxt, (String *)p_Var2->_M_nxt[1]._M_nxt != name)) {
      while (p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var3 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var3 = p_Var7, p_Var7 = p_Var4, (String *)p_Var4[1]._M_nxt == name))
        goto LAB_0013a331;
      }
      p_Var3 = (__node_base_ptr)0x0;
    }
LAB_0013a331:
    if (p_Var3 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var3->_M_nxt;
    }
    if (p_Var4 != (_Hash_node_base *)0x0) {
      return (LocalNameInfo *)(p_Var4 + 2);
    }
    pGVar6 = pGVar6->parent_;
  } while( true );
}

Assistant:

const LocalNameInfo * SearchFunctionLocalName(GenerateFunction *function,
                                                      String *name) const
        {
            auto block = function->current_block_;
            while (block)
            {
                auto it = block->names_.find(name);
                if (it != block->names_.end())
                    return &it->second;
                else
                    block = block->parent_;
            }

            return nullptr;
        }